

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
SharedPtrTests_advanced_Copy_Test::~SharedPtrTests_advanced_Copy_Test
          (SharedPtrTests_advanced_Copy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_advanced, Copy) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	EXPECT_EQ(t1.get(), t2.get());
	EXPECT_EQ(t1.use_count(),2);
	EXPECT_EQ(t2.use_count(),2);
}